

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_notif(lyout *out,int level,lys_node *node)

{
  lys_node_notif *notif;
  lys_node *sub;
  int flag;
  int i;
  lys_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  sub._0_4_ = 0;
  _flag = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  ly_print(out,"%*snotification %s",(ulong)(uint)(level << 1),"",node->name);
  node_local._4_4_ = node_local._4_4_ + 1;
  yang_print_snode_common(plStack_10,node_local._4_4_,_flag,_flag->module,(int *)&sub,3);
  for (sub._4_4_ = 0; sub._4_4_ < (int)(uint)node->padding[1]; sub._4_4_ = sub._4_4_ + 1) {
    yang_print_open(plStack_10,(int *)&sub);
    yang_print_must(plStack_10,node_local._4_4_,_flag->module,
                    (lys_restr *)(node[1].dsc + (long)sub._4_4_ * 0x38));
  }
  yang_print_snode_common(plStack_10,node_local._4_4_,_flag,_flag->module,(int *)&sub,0x70);
  for (sub._4_4_ = 0; sub._4_4_ < (int)(uint)*(ushort *)(node->padding + 2);
      sub._4_4_ = sub._4_4_ + 1) {
    yang_print_open(plStack_10,(int *)&sub);
    yang_print_typedef(plStack_10,node_local._4_4_,_flag->module,
                       (lys_tpdf *)(node[1].name + (long)sub._4_4_ * 0x80));
  }
  for (notif = (lys_node_notif *)_flag->child; notif != (lys_node_notif *)0x0;
      notif = (lys_node_notif *)notif->next) {
    if (notif->parent == _flag) {
      yang_print_open(plStack_10,(int *)&sub);
      yang_print_snode(plStack_10,node_local._4_4_,(lys_node *)notif,0x800);
    }
  }
  for (notif = (lys_node_notif *)_flag->child; notif != (lys_node_notif *)0x0;
      notif = (lys_node_notif *)notif->next) {
    if (notif->parent == _flag) {
      yang_print_open(plStack_10,(int *)&sub);
      yang_print_snode(plStack_10,node_local._4_4_,(lys_node *)notif,0x903f);
    }
  }
  node_local._4_4_ = node_local._4_4_ + -1;
  yang_print_close(plStack_10,node_local._4_4_,(int)sub);
  return;
}

Assistant:

static void
yang_print_notif(struct lyout *out, int level, const struct lys_node *node)
{
    int i, flag = 0;
    struct lys_node *sub;
    struct lys_node_notif *notif = (struct lys_node_notif *)node;

    ly_print(out, "%*snotification %s", LEVEL, INDENT, node->name);

    level++;
    yang_print_snode_common(out, level, node, node->module, &flag, SNODE_COMMON_EXT | SNODE_COMMON_IFF);
    for (i = 0; i < notif->must_size; i++) {
        yang_print_open(out, &flag);
        yang_print_must(out, level, node->module, &notif->must[i]);
    }
    yang_print_snode_common(out, level, node, node->module, &flag,
                            SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);
    for (i = 0; i < notif->tpdf_size; i++) {
        yang_print_open(out, &flag);
        yang_print_typedef(out, level, node->module, &notif->tpdf[i]);
    }
    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yang_print_open(out, &flag);
        yang_print_snode(out, level, sub, LYS_GROUPING);
    }
    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yang_print_open(out, &flag);
        yang_print_snode(out, level, sub,
                         LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                         LYS_USES | LYS_ANYDATA);
    }

    level--;
    yang_print_close(out, level, flag);
}